

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

int secp256k1_ecmult_pippenger_batch
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,
              size_t n_points,size_t cb_offset)

{
  long lVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  long lVar5;
  secp256k1_ge *psVar6;
  secp256k1_scalar *psVar7;
  secp256k1_scratch *psVar8;
  void *pvVar9;
  secp256k1_gej *psVar10;
  secp256k1_scalar *na;
  secp256k1_fe *psVar11;
  int iVar12;
  uint uVar13;
  undefined4 uVar14;
  int iVar15;
  secp256k1_callback *psVar16;
  secp256k1_gej *r_00;
  ulong uVar17;
  byte bVar18;
  long lVar19;
  secp256k1_gej *b;
  secp256k1_ge *psVar20;
  secp256k1_callback *error_callback_00;
  code *pcVar21;
  secp256k1_gej *psVar22;
  secp256k1_ecmult_multi_callback *psVar23;
  secp256k1_callback *psVar24;
  secp256k1_scratch *psVar25;
  ulong uVar26;
  secp256k1_scalar *psVar27;
  undefined1 auVar28 [16];
  secp256k1_gej running_sum;
  size_t sStack_298;
  secp256k1_strauss_state sStack_258;
  secp256k1_ge sStack_240;
  ulong uStack_1d8;
  secp256k1_gej *psStack_1d0;
  secp256k1_callback *psStack_1c8;
  secp256k1_scratch *psStack_1c0;
  secp256k1_gej *psStack_1b8;
  code *pcStack_1b0;
  uint local_1a4;
  secp256k1_callback *local_1a0;
  secp256k1_scratch *local_198;
  secp256k1_ecmult_multi_callback *local_190;
  secp256k1_ge *local_188;
  secp256k1_gej *local_180;
  secp256k1_scratch *local_178;
  secp256k1_scalar *local_170;
  long local_168;
  long local_160;
  secp256k1_scalar *local_158;
  code *local_150;
  uint local_148;
  uint local_144;
  secp256k1_gej *local_140;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  uint local_120;
  uint local_11c;
  long local_118;
  size_t local_110;
  secp256k1_gej *local_108;
  ulong local_100;
  ulong local_f8;
  size_t local_f0;
  secp256k1_gej *local_e8;
  secp256k1_scalar *local_e0;
  ulong local_d8;
  secp256k1_callback *local_d0;
  secp256k1_gej local_c8;
  
  bVar18 = 0;
  lVar5 = 0;
  do {
    iVar12 = (uint)scratch->magic[lVar5] - (uint)(byte)"scratch"[lVar5];
    if (scratch->magic[lVar5] != "scratch"[lVar5]) goto LAB_0011f1b1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  iVar12 = 0;
LAB_0011f1b1:
  local_1a0 = (secp256k1_callback *)cbdata;
  local_190 = cb;
  if (iVar12 == 0) {
    local_110 = scratch->alloc_size;
  }
  else {
    pcStack_1b0 = (code *)0x11f1c3;
    (*error_callback->fn)("invalid scratch space",error_callback->data);
    local_110 = 0;
  }
  pcStack_1b0 = (code *)0x11f1e5;
  secp256k1_gej_set_infinity(r);
  local_1a4 = 1;
  if (inp_g_sc != (secp256k1_scalar *)0x0 || n_points != 0) {
    lVar5 = n_points * 2 + 2;
    local_130 = 1;
    if ((((((1 < n_points) && (local_130 = 2, 4 < n_points)) && (local_130 = 3, 0x14 < n_points)) &&
         ((local_130 = 4, 0x39 < n_points && (local_130 = 5, 0x88 < n_points)))) &&
        ((local_130 = 6, 0xeb < n_points &&
         ((local_130 = 7, 0x4ec < n_points && (local_130 = 9, 0x1144 < n_points)))))) &&
       (local_130 = 10, 0x1ec8 < n_points)) {
      local_130 = (ulong)(0xc - (n_points < 0x3eb3));
    }
    pcStack_1b0 = (code *)0x11f2a0;
    local_158 = inp_g_sc;
    local_108 = r;
    psVar6 = (secp256k1_ge *)secp256k1_scratch_alloc(error_callback,scratch,lVar5 * 0x68);
    pcStack_1b0 = (code *)0x11f2b6;
    psVar7 = (secp256k1_scalar *)secp256k1_scratch_alloc(error_callback,scratch,lVar5 * 4);
    pcStack_1b0 = (code *)0x11f2c9;
    psVar8 = (secp256k1_scratch *)secp256k1_scratch_alloc(error_callback,scratch,0x10);
    local_188 = psVar6;
    local_170 = psVar7;
    local_d0 = error_callback;
    if ((psVar8 == (secp256k1_scratch *)0x0 || psVar7 == (secp256k1_scalar *)0x0) ||
        psVar6 == (secp256k1_ge *)0x0) {
      local_1a4 = 0;
    }
    else {
      pcStack_1b0 = (code *)0x11f315;
      pvVar9 = secp256k1_scratch_alloc(error_callback,scratch,lVar5 * 0x10);
      uVar26 = local_130;
      psVar8->data = pvVar9;
      uVar13 = (int)local_130 + 1;
      local_1a4 = 0;
      local_150 = (code *)CONCAT44(local_150._4_4_,uVar13);
      local_138 = 0x7f / (ulong)uVar13;
      local_d8 = (ulong)((int)local_138 + 1);
      pcStack_1b0 = (code *)0x11f363;
      local_198 = psVar8;
      pvVar9 = secp256k1_scratch_alloc(error_callback,scratch,lVar5 * local_d8 * 4);
      psVar8 = local_198;
      *(void **)local_198->magic = pvVar9;
      pcStack_1b0 = (code *)0x11f386;
      local_180 = (secp256k1_gej *)
                  secp256k1_scratch_alloc(error_callback,scratch,0x98L << ((byte)uVar26 & 0x3f));
      if (((psVar8->data != (void *)0x0) && (*(long *)psVar8->magic != 0)) &&
         (local_180 != (secp256k1_gej *)0x0)) {
        if (local_158 == (secp256k1_scalar *)0x0) {
          local_160 = 0;
        }
        else {
          *local_170 = *local_158;
          psVar6 = &secp256k1_ge_const_g;
          psVar20 = local_188;
          for (lVar5 = 0xd; lVar5 != 0; lVar5 = lVar5 + -1) {
            (psVar20->x).n[0] = (psVar6->x).n[0];
            psVar6 = (secp256k1_ge *)((long)psVar6 + ((ulong)bVar18 * -2 + 1) * 8);
            psVar20 = (secp256k1_ge *)((long)psVar20 + (ulong)bVar18 * -0x10 + 8);
          }
          pcStack_1b0 = (code *)0x11f3e7;
          secp256k1_ecmult_endo_split(local_170,local_170 + 1,local_188,local_188 + 1);
          local_160 = 2;
        }
        local_178 = scratch;
        if (n_points != 0) {
          psVar7 = local_170 + local_160;
          psVar6 = local_188 + local_160;
          do {
            pcStack_1b0 = (code *)0x11f437;
            iVar12 = (*local_190)(psVar7,psVar6,cb_offset,local_1a0);
            if (iVar12 == 0) {
              local_1a4 = 0;
              scratch = local_178;
              goto LAB_0011f9ee;
            }
            pcStack_1b0 = (code *)0x11f452;
            secp256k1_ecmult_endo_split(psVar7,psVar7 + 1,psVar6,psVar6 + 1);
            local_160 = local_160 + 2;
            cb_offset = cb_offset + 1;
            psVar7 = psVar7 + 2;
            psVar6 = psVar6 + 2;
            n_points = n_points - 1;
          } while (n_points != 0);
        }
        local_f8 = local_130 & 0xffffffff;
        scratch = local_178;
        if (local_160 == 0) {
          local_168 = 0;
        }
        else {
          bVar18 = (byte)local_130;
          local_120 = 0xffffffff >> (~bVar18 & 0x1f);
          local_140 = (secp256k1_gej *)(local_138 & 0xffffffff);
          local_1a4 = (int)local_138 * (uint)local_150;
          local_138 = (ulong)local_1a4;
          local_144 = -2 << (bVar18 & 0x1f);
          pcVar21 = (code *)(ulong)local_144;
          local_1a4 = 0x80 - local_1a4;
          local_100 = (ulong)local_150 & 0xffffffff;
          local_11c = 2 << (bVar18 & 0x1f);
          local_f0 = (long)local_140 * 4 + 4;
          psVar7 = (secp256k1_scalar *)(ulong)~(uint)local_130;
          local_158 = (secp256k1_scalar *)CONCAT44(local_158._4_4_,~(uint)local_130);
          local_e8 = (secp256k1_gej *)((long)local_140 * local_100);
          local_128 = ~local_f8;
          lVar5 = 0;
          local_168 = 0;
          uVar26 = local_130;
          psVar27 = local_170;
          do {
            pcStack_1b0 = (code *)0x11f53b;
            secp256k1_scalar_verify(psVar27 + lVar5);
            psVar6 = local_188;
            if (psVar27[lVar5] != 0) {
              pcStack_1b0 = (code *)0x11f560;
              local_1a0 = (secp256k1_callback *)(psVar27 + lVar5);
              secp256k1_ge_verify(local_188 + lVar5);
              psVar24 = local_1a0;
              if (psVar6[lVar5].infinity == 0) {
                local_e0 = (secp256k1_scalar *)(local_168 * 0x10);
                *(long *)((long)local_198->data + 8 + (long)local_e0) = lVar5;
                psVar23 = (secp256k1_ecmult_multi_callback *)
                          (local_168 * local_d8 * 4 + *(long *)local_198->magic);
                pcStack_1b0 = (code *)0x11f5af;
                psVar8 = local_198;
                secp256k1_scalar_verify((secp256k1_scalar *)local_1a0);
                if (*(int *)&psVar24->fn == 0) {
                  pcStack_1b0 = (code *)0x11f790;
                  memset(psVar23,0,local_f0);
                  uVar13 = 0;
                }
                else {
                  pcStack_1b0 = (code *)0x11f5cb;
                  local_118 = lVar5;
                  secp256k1_scalar_verify((secp256k1_scalar *)psVar24);
                  uVar13 = ~*(uint *)&psVar24->fn & 1;
                  pcStack_1b0 = (code *)0x11f5da;
                  secp256k1_scalar_verify((secp256k1_scalar *)psVar24);
                  pcStack_1b0 = (code *)0x11f5e2;
                  secp256k1_scalar_verify((secp256k1_scalar *)psVar24);
                  *(uint *)psVar23 = (*(uint *)&psVar24->fn & local_120) + uVar13;
                  uVar17 = local_138 & 0xffffffff;
                  psVar25 = (secp256k1_scratch *)0x0;
                  psVar22 = local_e8;
                  psVar10 = local_140;
                  local_190 = psVar23;
                  local_148 = uVar13;
                  do {
                    psVar24 = local_1a0;
                    uVar13 = (uint)local_150;
                    if (psVar25 == (secp256k1_scratch *)0x0) {
                      uVar13 = local_1a4;
                    }
                    pcStack_1b0 = (code *)0x11f62c;
                    secp256k1_scalar_verify((secp256k1_scalar *)local_1a0);
                    pcStack_1b0 = (code *)0x11f634;
                    error_callback_00 = psVar24;
                    secp256k1_scalar_verify((secp256k1_scalar *)psVar24);
                    scratch = local_178;
                    if (uVar13 - 0x21 < 0xffffffe0) {
                      pcStack_1b0 = (code *)0x11fa21;
                      secp256k1_ecmult_pippenger_batch_cold_2();
                      goto LAB_0011fa21;
                    }
                    if ((psVar22 < (secp256k1_gej *)0x20) &&
                       (psVar7 = (secp256k1_scalar *)
                                 (ulong)CONCAT31((int3)(uVar13 >> 8),-(char)uVar13),
                       (*(uint *)&local_1a0->fn >> ((byte)uVar17 & 0x1f)) << (-(char)uVar13 & 0x1fU)
                       != 0)) goto LAB_0011f689;
                    *(undefined4 *)(local_190 + (long)psVar10 * 4) = 0;
                    psVar25 = (secp256k1_scratch *)(psVar25->magic + 1);
                    uVar17 = (ulong)(uint)((int)uVar17 + (int)local_158);
                    psVar22 = (secp256k1_gej *)((long)(psVar22->x).n + local_128);
                    bVar2 = 1 < (long)psVar10;
                    psVar10 = (secp256k1_gej *)&psVar10[-1].field_0x97;
                  } while (bVar2);
                  psVar10 = (secp256k1_gej *)0x0;
LAB_0011f689:
                  lVar5 = local_118;
                  psVar27 = local_170;
                  uVar13 = local_148;
                  if (0 < (int)psVar10) {
                    psVar10 = (secp256k1_gej *)(ulong)((int)psVar10 + 1);
                    psVar22 = (secp256k1_gej *)0x1;
                    uVar17 = local_100;
                    do {
                      psVar24 = local_1a0;
                      uVar13 = (uint)local_150;
                      if (local_140 == psVar22) {
                        uVar13 = local_1a4;
                      }
                      pcStack_1b0 = (code *)0x11f6c5;
                      secp256k1_scalar_verify((secp256k1_scalar *)local_1a0);
                      pcStack_1b0 = (code *)0x11f6cd;
                      error_callback_00 = psVar24;
                      secp256k1_scalar_verify((secp256k1_scalar *)psVar24);
                      psVar25 = scratch;
                      if (uVar13 - 0x21 < 0xffffffe0) goto LAB_0011fa21;
                      uVar4 = 0;
                      if (uVar17 < 0x20) {
                        bVar18 = -(char)uVar13;
                        psVar7 = (secp256k1_scalar *)(ulong)CONCAT31((int3)(uVar13 >> 8),bVar18);
                        uVar4 = ((*(uint *)&local_1a0->fn >> ((byte)uVar17 & 0x1f)) <<
                                (bVar18 & 0x1f)) >> (bVar18 & 0x1f);
                      }
                      if ((uVar4 & 1) == 0) {
                        psVar7 = (secp256k1_scalar *)(ulong)local_144;
                        *(uint *)(local_190 + (long)psVar22 * 4 + -4) =
                             *(int *)(local_190 + (long)psVar22 * 4 + -4) + local_144;
                        uVar4 = uVar4 | 1;
                      }
                      *(uint *)(local_190 + (long)psVar22 * 4) = uVar4;
                      if (((secp256k1_gej *)0x1 < psVar22) &&
                         (((iVar12 = *(int *)(local_190 + (long)psVar22 * 4 + -4), iVar12 == 1 &&
                           (*(int *)(local_190 + (long)psVar22 * 4 + -8) < 0)) ||
                          ((iVar12 == -1 && (0 < *(int *)(local_190 + (long)psVar22 * 4 + -8)))))))
                      {
                        uVar13 = local_144;
                        if (iVar12 == 1) {
                          uVar13 = local_11c;
                        }
                        *(uint *)(local_190 + (long)psVar22 * 4 + -8) =
                             *(int *)(local_190 + (long)psVar22 * 4 + -8) + uVar13;
                        *(undefined4 *)(local_190 + (long)psVar22 * 4 + -4) = 0;
                      }
                      psVar22 = (secp256k1_gej *)((long)(psVar22->x).n + 1);
                      uVar17 = uVar17 + local_100;
                      lVar5 = local_118;
                      psVar27 = local_170;
                      uVar13 = local_148;
                    } while (psVar10 != psVar22);
                  }
                }
                *(uint *)((long)local_198->data + (long)local_e0) = uVar13;
                local_168 = local_168 + 1;
                psVar7 = local_e0;
              }
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 != local_160);
        }
        pcStack_1b0 = (code *)0x11f7e1;
        secp256k1_gej_set_infinity(local_108);
        local_1a4 = 1;
        if (local_168 != 0) {
          local_158 = (secp256k1_scalar *)(1L << ((byte)local_f8 & 0x3f));
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_f8 + 1;
          auVar3 = (ZEXT816(0) << 0x40 | ZEXT816(0x7f)) / auVar3;
          psVar23 = (secp256k1_ecmult_multi_callback *)(ulong)(uint)(auVar3._0_4_ << 2);
          local_150 = psVar23 + 4;
          uVar26 = (ulong)((int)local_158 - 2);
          local_128 = uVar26 + 2;
          local_140 = local_180 + uVar26 + 1;
          psVar22 = local_180;
          psVar7 = local_158;
          local_1a0 = auVar3._0_8_;
          do {
            do {
              pcStack_1b0 = (code *)0x11f86c;
              secp256k1_gej_set_infinity(psVar22);
              psVar7 = (secp256k1_scalar *)((long)psVar7 + -1);
              psVar22 = psVar22 + 1;
            } while (psVar7 != (secp256k1_scalar *)0x0);
            lVar19 = 8;
            lVar5 = local_168;
            local_190 = psVar23;
            do {
              psVar11 = *(secp256k1_fe **)local_198->magic;
              uVar13 = *(uint *)(psVar23 + (long)psVar11->n);
              lVar1 = *(long *)((long)local_198->data + lVar19);
              if ((local_1a0 == (secp256k1_callback *)0x0) &&
                 (*(int *)((long)local_198->data + lVar19 + -8) != 0)) {
                pcStack_1b0 = (code *)0x11f8bb;
                secp256k1_ge_neg((secp256k1_ge *)&local_c8,local_188 + lVar1);
                psVar11 = (secp256k1_fe *)0x0;
                pcStack_1b0 = (code *)0x11f8cd;
                secp256k1_gej_add_ge_var
                          (local_180,local_180,(secp256k1_ge *)&local_c8,(secp256k1_fe *)0x0);
              }
              if ((int)uVar13 < 1) {
                if ((int)uVar13 < 0) {
                  pcStack_1b0 = (code *)0x11f926;
                  secp256k1_ge_neg((secp256k1_ge *)&local_c8,local_188 + lVar1);
                  psVar10 = local_180 + (~uVar13 >> 1);
                  psVar22 = &local_c8;
                  goto LAB_0011f8f0;
                }
              }
              else {
                psVar10 = local_180 + (uVar13 - 1 >> 1);
                psVar22 = (secp256k1_gej *)(local_188 + lVar1);
LAB_0011f8f0:
                psVar11 = (secp256k1_fe *)0x0;
                pcStack_1b0 = (code *)0x11f8f7;
                secp256k1_gej_add_ge_var
                          (psVar10,psVar10,(secp256k1_ge *)psVar22,(secp256k1_fe *)0x0);
              }
              psVar10 = local_108;
              lVar19 = lVar19 + 0x10;
              psVar23 = psVar23 + (long)local_150;
              lVar5 = lVar5 + -1;
            } while (lVar5 != 0);
            uVar26 = local_130 & 0xffffffff;
            do {
              pcStack_1b0 = (code *)0x11f956;
              secp256k1_gej_double_var(psVar10,psVar10,(secp256k1_fe *)0x0);
              uVar13 = (int)uVar26 - 1;
              uVar26 = (ulong)uVar13;
            } while (uVar13 != 0);
            pcStack_1b0 = (code *)0x11f962;
            secp256k1_gej_set_infinity(&local_c8);
            b = local_140;
            uVar26 = local_128;
            do {
              pcStack_1b0 = (code *)0x11f97d;
              secp256k1_gej_add_var(&local_c8,&local_c8,b,psVar11);
              pcStack_1b0 = (code *)0x11f98b;
              secp256k1_gej_add_var(psVar10,psVar10,&local_c8,psVar11);
              psVar22 = local_180;
              uVar26 = uVar26 - 1;
              b = b + -1;
            } while (1 < (long)uVar26);
            pcStack_1b0 = (code *)0x11f9ae;
            secp256k1_gej_add_var(&local_c8,&local_c8,local_180,psVar11);
            pcStack_1b0 = (code *)0x11f9bb;
            secp256k1_gej_double_var(psVar10,psVar10,(secp256k1_fe *)0x0);
            pcStack_1b0 = (code *)0x11f9c9;
            secp256k1_gej_add_var(psVar10,psVar10,&local_c8,psVar11);
            psVar24 = (secp256k1_callback *)((long)&local_1a0[-1].data + 7);
            psVar23 = local_190 + -4;
            bVar2 = 0 < (long)local_1a0;
            psVar7 = local_158;
            scratch = local_178;
            local_1a0 = psVar24;
          } while (bVar2);
        }
      }
    }
LAB_0011f9ee:
    pcStack_1b0 = (code *)0x11fa06;
    secp256k1_scratch_apply_checkpoint(local_d0,scratch,local_110);
  }
  return local_1a4;
LAB_0011fa21:
  pcStack_1b0 = secp256k1_ecmult_strauss_batch;
  secp256k1_ecmult_pippenger_batch_cold_1();
  lVar5 = 0;
  do {
    iVar12 = (uint)psVar8->magic[lVar5] - (uint)(byte)"scratch"[lVar5];
    if (psVar8->magic[lVar5] != "scratch"[lVar5]) goto LAB_0011fa79;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  iVar12 = 0;
LAB_0011fa79:
  uStack_1d8 = uVar17;
  psStack_1d0 = psVar22;
  psStack_1c8 = psVar24;
  psStack_1c0 = psVar25;
  psStack_1b8 = psVar10;
  pcStack_1b0 = (code *)(ulong)uVar13;
  if (iVar12 == 0) {
    sStack_298 = psVar8->alloc_size;
  }
  else {
    (*error_callback_00->fn)("invalid scratch space",error_callback_00->data);
    sStack_298 = 0;
  }
  secp256k1_gej_set_infinity(r_00);
  psVar24 = local_1a0;
  iVar12 = 1;
  if (psVar7 != (secp256k1_scalar *)0x0 || local_1a0 != (secp256k1_callback *)0x0) {
    psVar16 = local_1a0;
    psVar10 = (secp256k1_gej *)
              secp256k1_scratch_alloc(error_callback_00,psVar8,(long)local_1a0 * 0x98);
    uVar14 = SUB84(psVar16,0);
    na = (secp256k1_scalar *)secp256k1_scratch_alloc(error_callback_00,psVar8,(long)psVar24 * 4);
    psVar11 = (secp256k1_fe *)secp256k1_scratch_alloc(error_callback_00,psVar8,(long)psVar24 * 0xc0)
    ;
    sStack_258.aux = psVar11;
    psVar6 = (secp256k1_ge *)secp256k1_scratch_alloc(error_callback_00,psVar8,(long)psVar24 * 0x1a0)
    ;
    sStack_258.pre_a = psVar6;
    sStack_258.ps =
         (secp256k1_strauss_point_state *)
         secp256k1_scratch_alloc(error_callback_00,psVar8,(long)psVar24 * 0x410);
    auVar28._0_4_ = -(uint)((int)((ulong)psVar10 >> 0x20) == 0 && (int)psVar10 == 0);
    auVar28._4_4_ = -(uint)((int)na == 0 && (int)((ulong)na >> 0x20) == 0);
    auVar28._8_4_ = -(uint)((int)((ulong)psVar11 >> 0x20) == 0 && (int)psVar11 == 0);
    auVar28._12_4_ = -(uint)((int)psVar6 == 0 && (int)((ulong)psVar6 >> 0x20) == 0);
    iVar15 = movmskps(uVar14,auVar28);
    iVar12 = 0;
    psVar22 = psVar10;
    psVar27 = na;
    psVar24 = local_1a0;
    psVar25 = local_198;
    if (iVar15 == 0 && sStack_258.ps != (secp256k1_strauss_point_state *)0x0) {
      for (; psVar24 != (secp256k1_callback *)0x0;
          psVar24 = (secp256k1_callback *)((long)&psVar24[-1].data + 7)) {
        iVar12 = (*pcVar21)(psVar27,&sStack_240,psVar25,uVar26);
        if (iVar12 == 0) {
          secp256k1_scratch_apply_checkpoint(error_callback_00,psVar8,sStack_298);
          return 0;
        }
        secp256k1_gej_set_ge(psVar22,&sStack_240);
        psVar22 = psVar22 + 1;
        psVar27 = psVar27 + 1;
        psVar25 = (secp256k1_scratch *)(psVar25->magic + 1);
      }
      secp256k1_ecmult_strauss_wnaf(&sStack_258,r_00,(size_t)local_1a0,psVar10,na,psVar7);
      iVar12 = 1;
    }
    secp256k1_scratch_apply_checkpoint(error_callback_00,psVar8,sStack_298);
  }
  return iVar12;
}

Assistant:

static int secp256k1_ecmult_pippenger_batch(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points, size_t cb_offset) {
    const size_t scratch_checkpoint = secp256k1_scratch_checkpoint(error_callback, scratch);
    /* Use 2(n+1) with the endomorphism, when calculating batch
     * sizes. The reason for +1 is that we add the G scalar to the list of
     * other scalars. */
    size_t entries = 2*n_points + 2;
    secp256k1_ge *points;
    secp256k1_scalar *scalars;
    secp256k1_gej *buckets;
    struct secp256k1_pippenger_state *state_space;
    size_t idx = 0;
    size_t point_idx = 0;
    int bucket_window;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n_points == 0) {
        return 1;
    }
    bucket_window = secp256k1_pippenger_bucket_window(n_points);

    /* We allocate PIPPENGER_SCRATCH_OBJECTS objects on the scratch space. If
     * these allocations change, make sure to update the
     * PIPPENGER_SCRATCH_OBJECTS constant and pippenger_scratch_size
     * accordingly. */
    points = (secp256k1_ge *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*points));
    scalars = (secp256k1_scalar *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*scalars));
    state_space = (struct secp256k1_pippenger_state *) secp256k1_scratch_alloc(error_callback, scratch, sizeof(*state_space));
    if (points == NULL || scalars == NULL || state_space == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }
    state_space->ps = (struct secp256k1_pippenger_point_state *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*state_space->ps));
    state_space->wnaf_na = (int *) secp256k1_scratch_alloc(error_callback, scratch, entries*(WNAF_SIZE(bucket_window+1)) * sizeof(int));
    buckets = (secp256k1_gej *) secp256k1_scratch_alloc(error_callback, scratch, ((size_t)1 << bucket_window) * sizeof(*buckets));
    if (state_space->ps == NULL || state_space->wnaf_na == NULL || buckets == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }

    if (inp_g_sc != NULL) {
        scalars[0] = *inp_g_sc;
        points[0] = secp256k1_ge_const_g;
        idx++;
        secp256k1_ecmult_endo_split(&scalars[0], &scalars[1], &points[0], &points[1]);
        idx++;
    }

    while (point_idx < n_points) {
        if (!cb(&scalars[idx], &points[idx], point_idx + cb_offset, cbdata)) {
            secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
            return 0;
        }
        idx++;
        secp256k1_ecmult_endo_split(&scalars[idx - 1], &scalars[idx], &points[idx - 1], &points[idx]);
        idx++;
        point_idx++;
    }

    secp256k1_ecmult_pippenger_wnaf(buckets, bucket_window, state_space, r, scalars, points, idx);
    secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
    return 1;
}